

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::NoAssertionsInSection(BasicReporter *this,string *sectionName)

{
  ostream *poVar1;
  string *in_RSI;
  long in_RDI;
  Colour colour;
  BasicReporter *in_stack_00000070;
  undefined8 in_stack_ffffffffffffffb8;
  Code _colourCode;
  Colour *in_stack_ffffffffffffffc0;
  
  _colourCode = (Code)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  startSpansLazily(in_stack_00000070);
  Colour::Colour(in_stack_ffffffffffffffc0,_colourCode);
  poVar1 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
  poVar1 = std::operator<<(poVar1,"\nNo assertions in section, \'");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1,"\'\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Colour::~Colour((Colour *)0x1823c9);
  return;
}

Assistant:

virtual void NoAssertionsInSection( const std::string& sectionName ) {
            startSpansLazily();
            Colour colour( Colour::ResultError );
            m_config.stream() << "\nNo assertions in section, '" << sectionName << "'\n" << std::endl;
        }